

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O1

void multipcm_w_quick(void *info,UINT8 offset,UINT8 data)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  
  uVar2 = (uint)CONCAT71(in_register_00000031,offset);
  uVar3 = uVar2 >> 3;
  iVar1 = VALUE_TO_CHANNEL[uVar3];
  *(int *)((long)info + 0x10a8) = iVar1;
  uVar2 = uVar2 & 7;
  *(uint *)((long)info + 0x10ac) = uVar2;
  if ((0x80808080U >> (uVar3 & 0x1f) & 1) == 0) {
    write_slot((MultiPCM *)info,(slot_t *)((long)info + (long)iVar1 * 0x98 + 8),uVar2,data);
    return;
  }
  return;
}

Assistant:

static void multipcm_w_quick(void *info, UINT8 offset, UINT8 data)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	ptChip->cur_slot = VALUE_TO_CHANNEL[(offset >> 3) & 0x1F];
	ptChip->address = offset & 0x07;
	if (ptChip->cur_slot == -1)
		return;
	write_slot(ptChip, ptChip->slots + ptChip->cur_slot, ptChip->address, data);
}